

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_variant.cc
# Opt level: O0

void __thiscall
VariantMoveTest_move_assign_emplace_C_Test::~VariantMoveTest_move_assign_emplace_C_Test
          (VariantMoveTest_move_assign_emplace_C_Test *this)

{
  VariantMoveTest_move_assign_emplace_C_Test *this_local;
  
  ~VariantMoveTest_move_assign_emplace_C_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST_F(VariantMoveTest, move_assign_emplace_C) {
    {
        Variant<A, B, C> v1{};
        Variant<A, B, C> v2{};
        v1.emplace<C>();

        EXPECT_EQ(ctor_count, 1);
        EXPECT_EQ(move_ctor_count, 0);
        EXPECT_EQ(dtor_count, 0);

        v2 = std::move(v1);

        EXPECT_EQ(ctor_count, 1);
        EXPECT_EQ(move_ctor_count, 2);
        EXPECT_EQ(dtor_count, 1);
    }
    EXPECT_EQ(ctor_count, 1);
    EXPECT_EQ(move_ctor_count, 2);
    EXPECT_EQ(dtor_count, 3);
}